

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::TransformNode::TransformNode
          (TransformNode *this,Transformations *spaces,Ref<embree::SceneGraph::Node> *child)

{
  avector<AffineSpace3ff> *paVar1;
  undefined8 *in_RDX;
  Transformations *in_RDI;
  bool in_stack_ffffffffffffffaf;
  Node *in_stack_ffffffffffffffb0;
  
  Node::Node(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
  in_RDI->time_range = (BBox1f)&PTR__TransformNode_00623020;
  Transformations::Transformations((Transformations *)&in_RDI[2].spaces,in_RDI);
  paVar1 = &in_RDI[3].spaces;
  *(undefined8 *)paVar1 = *in_RDX;
  if (*(long *)paVar1 != 0) {
    (**(code **)(**(long **)paVar1 + 0x10))();
  }
  return;
}

Assistant:

TransformNode(const Transformations& spaces, const Ref<Node>& child)
        : spaces(spaces), child(child) {}